

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

string * string_trim(string *__return_storage_ptr__,string *input)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  int local_20;
  int local_1c;
  int last;
  int first;
  string *input_local;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_1c = 0;
    local_20 = std::__cxx11::string::size();
    local_20 = local_20 + -1;
    while( true ) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)input);
      iVar1 = isspace((int)*pcVar3);
      if (iVar1 == 0 || local_20 <= local_1c) break;
      local_1c = local_1c + 1;
    }
    while( true ) {
      pcVar3 = (char *)std::__cxx11::string::at((ulong)input);
      iVar1 = isspace((int)*pcVar3);
      if (iVar1 == 0 || local_20 <= local_1c) break;
      local_20 = local_20 + -1;
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)input);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string string_trim(const std::string &input)
{
    if (input.size() < 1)
        return std::string();
    int first = 0, last = input.size() - 1;
    while (std::isspace(input.at(first)) && first < last) ++first;
    while (std::isspace(input.at(last)) && first < last) --last;
    return input.substr(first, last+1);
}